

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::DBImpl(DBImpl *this,Options *raw_options,string *dbname)

{
  long lVar1;
  int iVar2;
  VersionSet *this_00;
  void *pvVar3;
  long in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  Options *in_stack_ffffffffffffff18;
  Mutex *in_stack_ffffffffffffff20;
  undefined8 *puVar4;
  CondVar *in_stack_ffffffffffffff28;
  WriteBatch *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff50;
  int entries;
  Options *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  Options *in_stack_ffffffffffffff68;
  InternalFilterPolicy *in_stack_ffffffffffffff70;
  InternalKeyComparator *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  InternalKeyComparator *cmp;
  TableCache *table_cache;
  undefined4 in_stack_ffffffffffffff98;
  string *dbname_00;
  
  entries = (int)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  DB::DB((DB *)in_stack_ffffffffffffff18);
  *in_RDI = &PTR__DBImpl_016178b0;
  in_RDI[1] = *(undefined8 *)(in_RSI + 0x10);
  InternalKeyComparator::InternalKeyComparator
            ((InternalKeyComparator *)in_stack_ffffffffffffff28,
             (Comparator *)in_stack_ffffffffffffff20);
  InternalFilterPolicy::InternalFilterPolicy
            ((InternalFilterPolicy *)in_stack_ffffffffffffff28,
             (FilterPolicy *)in_stack_ffffffffffffff20);
  SanitizeOptions(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                  in_stack_ffffffffffffff68);
  *(bool *)(in_RDI + 0x12) = in_RDI[9] != *(long *)(in_RSI + 0x18);
  *(bool *)((long)in_RDI + 0x91) = in_RDI[0xc] != *(long *)(in_RSI + 0x30);
  std::__cxx11::string::string
            (in_stack_ffffffffffffff60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff58);
  dbname_00 = (string *)(in_RDI + 0x17);
  this_00 = (VersionSet *)operator_new(0x38);
  cmp = (InternalKeyComparator *)(in_RDI + 0x13);
  table_cache = (TableCache *)(in_RDI + 6);
  iVar2 = TableCacheSize(in_stack_ffffffffffffff18);
  TableCache::TableCache
            ((TableCache *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58,entries);
  (dbname_00->_M_dataplus)._M_p = (pointer)this_00;
  in_RDI[0x18] = 0;
  port::Mutex::Mutex((Mutex *)in_stack_ffffffffffffff18);
  std::atomic<bool>::atomic((atomic<bool> *)in_stack_ffffffffffffff18,false);
  port::CondVar::CondVar(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  in_RDI[0x26] = 0;
  in_RDI[0x27] = 0;
  std::atomic<bool>::atomic((atomic<bool> *)in_stack_ffffffffffffff18,false);
  in_RDI[0x29] = 0;
  in_RDI[0x2a] = 0;
  in_RDI[0x2b] = 0;
  *(undefined4 *)(in_RDI + 0x2c) = 0;
  std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::deque
            ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_> *)
             in_stack_ffffffffffffff18);
  puVar4 = in_RDI + 0x37;
  pvVar3 = operator_new(0x20);
  WriteBatch::WriteBatch(in_stack_ffffffffffffff38);
  *puVar4 = pvVar3;
  SnapshotList::SnapshotList((SnapshotList *)in_stack_ffffffffffffff18);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             in_stack_ffffffffffffff18);
  *(undefined1 *)(in_RDI + 0x43) = 0;
  in_RDI[0x44] = 0;
  pvVar3 = operator_new(0x250);
  VersionSet::VersionSet
            (this_00,dbname_00,(Options *)CONCAT44(iVar2,in_stack_ffffffffffffff98),table_cache,cmp)
  ;
  in_RDI[0x45] = pvVar3;
  Status::Status((Status *)in_stack_ffffffffffffff18);
  puVar4 = in_RDI + 0x47;
  do {
    CompactionStats::CompactionStats((CompactionStats *)in_stack_ffffffffffffff18);
    puVar4 = puVar4 + 3;
  } while (puVar4 != in_RDI + 0x5c);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

DBImpl::DBImpl(const Options& raw_options, const std::string& dbname)
    : env_(raw_options.env),
      internal_comparator_(raw_options.comparator),
      internal_filter_policy_(raw_options.filter_policy),
      options_(SanitizeOptions(dbname, &internal_comparator_,
                               &internal_filter_policy_, raw_options)),
      owns_info_log_(options_.info_log != raw_options.info_log),
      owns_cache_(options_.block_cache != raw_options.block_cache),
      dbname_(dbname),
      table_cache_(new TableCache(dbname_, options_, TableCacheSize(options_))),
      db_lock_(nullptr),
      shutting_down_(false),
      background_work_finished_signal_(&mutex_),
      mem_(nullptr),
      imm_(nullptr),
      has_imm_(false),
      logfile_(nullptr),
      logfile_number_(0),
      log_(nullptr),
      seed_(0),
      tmp_batch_(new WriteBatch),
      background_compaction_scheduled_(false),
      manual_compaction_(nullptr),
      versions_(new VersionSet(dbname_, &options_, table_cache_,
                               &internal_comparator_)) {}